

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int diff_nims_list(nifti_image *s0,nifti_image *s1,str_list *slist,int display)

{
  int iVar1;
  field_s *fieldp;
  int local_40;
  int local_3c;
  int ndiff;
  int c;
  char **sptr;
  field_s *fp;
  int display_local;
  str_list *slist_local;
  nifti_image *s1_local;
  nifti_image *s0_local;
  
  local_40 = 0;
  _ndiff = slist->list;
  for (local_3c = 0; local_3c < slist->len; local_3c = local_3c + 1) {
    fieldp = get_nim_field(*_ndiff,1);
    if ((fieldp != (field_s *)0x0) && (iVar1 = diff_field(fieldp,s0,s1,1), iVar1 != 0)) {
      if (display != 0) {
        disp_field((char *)0x0,fieldp,s0,1,(uint)(local_40 == 0));
        disp_field((char *)0x0,fieldp,s1,1,0);
      }
      local_40 = local_40 + 1;
    }
    _ndiff = _ndiff + 1;
  }
  return local_40;
}

Assistant:

int diff_nims_list( nifti_image * s0, nifti_image * s1, str_list * slist,
                    int display )
{
   field_s  * fp;
   char    ** sptr;
   int        c, ndiff = 0;

   sptr = slist->list;
   for( c = 0; c < slist->len; c++ )
   {
      fp = get_nim_field(*sptr, 1);    /* "not found" displayed in func */
      if( fp && diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }
      sptr++;
   }

   return ndiff;
}